

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O2

void __thiscall Diligent::GLContextState::SetStencilRef(GLContextState *this,GLenum Face,Int32 Ref)

{
  GLenum GVar1;
  GLenum err;
  string msg;
  uint local_44;
  string local_40;
  
  GVar1 = CompareFuncToGLCompareFunc((this->m_DSState).m_StencilOpState[Face != 0x404].Func);
  (*__glewStencilFuncSeparate)
            (Face,GVar1,Ref,(this->m_DSState).m_StencilOpState[Face != 0x404].Mask);
  local_44 = glGetError();
  if (local_44 != 0) {
    LogError<false,char[31],char[17],unsigned_int>
              (false,"SetStencilRef",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x21b,(char (*) [31])"Failed to set stencil function",
               (char (*) [17])"\nGL Error Code: ",&local_44);
    FormatString<char[6]>(&local_40,(char (*) [6])0x731c01);
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"SetStencilRef",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x21b);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void GLContextState::SetStencilRef(GLenum Face, Int32 Ref)
{
    DepthStencilGLState::StencilOpState& FaceStencilOp = m_DSState.m_StencilOpState[Face == GL_FRONT ? 0 : 1];
    GLenum                               GlStencilFunc = CompareFuncToGLCompareFunc(FaceStencilOp.Func);
    glStencilFuncSeparate(Face, GlStencilFunc, Ref, FaceStencilOp.Mask);
    DEV_CHECK_GL_ERROR("Failed to set stencil function");
}